

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

string * __thiscall higan::Buffer::ReadLine_abi_cxx11_(string *__return_storage_ptr__,Buffer *this)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  size_t len;
  char local_29;
  char *local_28;
  char *line_end;
  Buffer *local_18;
  Buffer *this_local;
  string *result;
  
  line_end._7_1_ = 0;
  local_18 = this;
  this_local = (Buffer *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  pcVar1 = ReadBegin(this);
  pcVar2 = ReadBegin(this);
  sVar3 = ReadableSize(this);
  local_29 = '\n';
  pcVar1 = std::find<char*,char>(pcVar1,pcVar2 + sVar3,&local_29);
  if (pcVar1 != (char *)0x0) {
    local_28 = pcVar1;
    pcVar2 = ReadBegin(this);
    pcVar4 = ReadBegin(this);
    std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)pcVar4);
    AddReadIndex(this,(size_t)(pcVar1 + (1 - (long)pcVar2)));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Buffer::ReadLine()
{
	std::string result;
	const char* line_end = std::find(ReadBegin(), ReadBegin() + ReadableSize(), '\n');

	if (!line_end)
	{
		return result;
	}

	size_t len = line_end - ReadBegin();
	result.append(ReadBegin(), len);
	AddReadIndex(len + 1);

	return result;
}